

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupNewFolder(void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  IStorage *pIVar4;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  CEditor *pEditor;
  CUIRect ButtonBar;
  CUIRect Label;
  char aBuf [512];
  CUIRect *in_stack_fffffffffffffd88;
  CUIRect *pLeft;
  undefined4 in_stack_fffffffffffffd90;
  float in_stack_fffffffffffffd94;
  CLineInput *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined1 uVar5;
  float in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  CEditor *pRect;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  bool bVar6;
  CEditor *in_stack_fffffffffffffdc8;
  char *pToolTip;
  char local_208 [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pToolTip = (char *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pRect = in_RDI;
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                     in_stack_fffffffffffffd88,(CUIRect *)0x2142f0);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                     in_stack_fffffffffffffd88,(CUIRect *)0x21430a);
  UI(in_RDI);
  CUI::DoLabel((CUI *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),(CUIRect *)pRect
               ,(char *)in_RDI,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffda4,SUB41((uint)in_stack_fffffffffffffda0 >> 0x18,0));
  CUIRect::HSplitBottom
            ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
             in_stack_fffffffffffffd88,(CUIRect *)0x21435a);
  CUIRect::HSplitBottom
            ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
             in_stack_fffffffffffffd88,(CUIRect *)0x214374);
  if (in_RDI->m_aFileDialogErrString[0] == '\0') {
    CUIRect::HSplitBottom
              ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
               in_stack_fffffffffffffd88,(CUIRect *)0x2143a2);
    CUIRect::VMargin((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                     in_stack_fffffffffffffd88);
    CUIRect::HSplitBottom
              ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
               in_stack_fffffffffffffd88,(CUIRect *)0x2143d1);
    if ((PopupNewFolder(void*,CUIRect)::s_FolderInput == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PopupNewFolder(void*,CUIRect)::s_FolderInput), iVar2 != 0)) {
      CLineInput::CLineInput
                ((CLineInput *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 (int)in_stack_fffffffffffffda4);
      __cxa_atexit(CLineInput::~CLineInput,&PopupNewFolder::s_FolderInput,&__dso_handle);
      __cxa_guard_release(&PopupNewFolder(void*,CUIRect)::s_FolderInput);
    }
    DoEditBox((CEditor *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
              in_stack_fffffffffffffd98,
              (CUIRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
              (float)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    uVar5 = (undefined1)((uint)in_stack_fffffffffffffda0 >> 0x18);
    CUIRect::HSplitBottom
              ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
               in_stack_fffffffffffffd88,(CUIRect *)0x214468);
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                 ,in_stack_fffffffffffffda4,(bool)uVar5);
    CUIRect::VSplitLeft((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                        in_stack_fffffffffffffd88,(CUIRect *)0x2144b7);
    CUIRect::VSplitLeft((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                        in_stack_fffffffffffffd88,(CUIRect *)0x2144d1);
    pLeft = (CUIRect *)0x0;
    iVar2 = DoButton_Editor(in_stack_fffffffffffffdc8,
                            (void *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                            (char *)pRect,(int)((ulong)in_RDI >> 0x20),
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                            ,(int)in_stack_fffffffffffffda4,pToolTip);
    if ((iVar2 != 0) && (in_RDI->m_aFileDialogNewFolderName[0] != '\0')) {
      str_format(local_208,0x200,"%s/%s",in_RDI->m_pFileDialogPath,
                 in_RDI->m_aFileDialogNewFolderName);
      pIVar4 = Storage(in_RDI);
      uVar3 = (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])(pIVar4,local_208,0);
      if ((uVar3 & 1) != 0) {
        FilelistPopulate((CEditor *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         (int)((ulong)pLeft >> 0x20));
        bVar6 = true;
        goto LAB_0021476e;
      }
      str_copy((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),(char *)pLeft,0
              );
    }
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    CUIRect::VSplitRight
              ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,pLeft,
               (CUIRect *)0x2145dc);
    CUIRect::VSplitRight
              ((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,pLeft,
               (CUIRect *)0x2145f6);
    iVar2 = DoButton_Editor(in_stack_fffffffffffffdc8,
                            (void *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                            (char *)pRect,iVar2,
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                            ,(int)in_stack_fffffffffffffda4,pToolTip);
    if (iVar2 != 0) {
      bVar6 = true;
      goto LAB_0021476e;
    }
  }
  else {
    CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                       in_stack_fffffffffffffd88,(CUIRect *)0x214650);
    uVar5 = (undefined1)((uint)in_stack_fffffffffffffda0 >> 0x18);
    CUIRect::VMargin((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                     in_stack_fffffffffffffd88);
    CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                       in_stack_fffffffffffffd88,(CUIRect *)0x21467f);
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                 ,in_stack_fffffffffffffda4,(bool)uVar5);
    CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                       in_stack_fffffffffffffd88,(CUIRect *)0x2146cf);
    UI(in_RDI);
    CUI::DoLabel((CUI *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (CUIRect *)pRect,(char *)in_RDI,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                 ,in_stack_fffffffffffffda4,(bool)uVar5);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    CUIRect::VMargin((CUIRect *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                     in_stack_fffffffffffffd88);
    iVar2 = DoButton_Editor(in_stack_fffffffffffffdc8,
                            (void *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                            (char *)pRect,iVar2,
                            (CUIRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                            ,(int)in_stack_fffffffffffffda4,pToolTip);
    if (iVar2 != 0) {
      bVar6 = true;
      goto LAB_0021476e;
    }
  }
  bVar6 = false;
LAB_0021476e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CEditor::PopupNewFolder(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	pEditor->UI()->DoLabel(&Label, "Create new folder", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	if(pEditor->m_aFileDialogErrString[0] == 0)
	{
		// interaction box
		View.HSplitBottom(40.0f, &View, 0);
		View.VMargin(40.0f, &View);
		View.HSplitBottom(20.0f, &View, &Label);
		static CLineInput s_FolderInput(pEditor->m_aFileDialogNewFolderName, sizeof(pEditor->m_aFileDialogNewFolderName));
		pEditor->DoEditBox(&s_FolderInput, &Label, 15.0f);
		View.HSplitBottom(20.0f, &View, &Label);
		pEditor->UI()->DoLabel(&Label, "Name:", 10.0f, TEXTALIGN_LEFT);

		// button bar
		ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
		ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Create", 0, &Label, 0, 0))
		{
			// create the folder
			if(pEditor->m_aFileDialogNewFolderName[0])
			{
				char aBuf[IO_MAX_PATH_LENGTH];
				str_format(aBuf, sizeof(aBuf), "%s/%s", pEditor->m_pFileDialogPath, pEditor->m_aFileDialogNewFolderName);
				if(pEditor->Storage()->CreateFolder(aBuf, IStorage::TYPE_SAVE))
				{
					pEditor->FilelistPopulate(IStorage::TYPE_SAVE);
					return true;
				}
				else
					str_copy(pEditor->m_aFileDialogErrString, "Unable to create the folder", sizeof(pEditor->m_aFileDialogErrString));
			}
		}
		ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
		ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
		static int s_AbortButton = 0;
		if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
			return true;
	}
	else
	{
		// error text
		View.HSplitTop(30.0f, 0, &View);
		View.VMargin(40.0f, &View);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Error:", 10.0f, TEXTALIGN_LEFT);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Unable to create the folder", 10.0f, TEXTALIGN_LEFT, View.w);

		// button
		ButtonBar.VMargin(ButtonBar.w/2.0f-55.0f, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Ok", 0, &ButtonBar, 0, 0))
			return true;
	}

	return false;
}